

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

bool __thiscall
flow::lang::Parser::consumeOne<flow::lang::Token,flow::lang::Token>
          (Parser *this,Token a1,Token tokens)

{
  Report *this_00;
  bool bVar1;
  Token args;
  SourceLocation *sloc;
  allocator<char> local_41;
  string local_40;
  Token local_20;
  Token local_1c;
  Token tokens_local;
  Token a1_local;
  Parser *this_local;
  
  local_20 = tokens;
  local_1c = a1;
  _tokens_local = this;
  bVar1 = testTokens<flow::lang::Token,flow::lang::Token>(this,a1,tokens);
  if (bVar1) {
    nextToken(this);
  }
  else {
    this_00 = this->report_;
    sloc = lastLocation(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Unexpected token {}",&local_41);
    args = token(this);
    diagnostics::Report::syntaxError<flow::lang::Token>(this_00,sloc,&local_40,args);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return bVar1;
}

Assistant:

inline bool Parser::consumeOne(A1 a1, Args... tokens) {
  if (!testTokens(a1, tokens...)) {
    report_.syntaxError(lastLocation(), "Unexpected token {}", token());
    return false;
  }

  nextToken();
  return true;
}